

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlSchemaTypePtr
xmlSchemaParseExtension
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,
          xmlSchemaTypeType parentType)

{
  xmlChar **uri;
  _xmlAttr *p_Var1;
  xmlSchemaTypePtr pxVar2;
  xmlSchemaTypeType xVar3;
  xmlSchemaPtr schema_00;
  int iVar4;
  xmlAttrPtr pxVar5;
  undefined4 extraout_var;
  xmlSchemaTypePtr extraout_RAX;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  xmlSchemaAnnotPtr annot;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  xmlSchemaTypePtr pxVar6;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  xmlSchemaWildcardPtr pxVar7;
  xmlSchemaTypePtr extraout_RAX_00;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  xmlSchemaTypeType type;
  undefined4 in_register_0000000c;
  xmlNodePtr ownerElem;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr ownerComp;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlChar **name;
  xmlChar **message;
  char *message_00;
  xmlNodePtr child;
  xmlChar **in_stack_ffffffffffffffa8;
  xmlSchemaTypePtr local_50;
  xmlSchemaTypePtr local_48;
  xmlSchemaTypeType local_3c;
  xmlSchemaPtr local_38;
  
  pxVar5 = (xmlAttrPtr)CONCAT44(in_register_0000000c,parentType);
  local_50 = (xmlSchemaTypePtr)0x0;
  local_48 = ctxt->ctxtType;
  local_48->flags = local_48->flags | 2;
  local_38 = schema;
  local_3c = parentType;
  for (p_Var1 = node->properties; p_Var1 != (_xmlAttr *)0x0; p_Var1 = p_Var1->next) {
    if (p_Var1->ns == (xmlNs *)0x0) {
      iVar4 = xmlStrEqual(p_Var1->name,"id");
      if ((iVar4 == 0) &&
         (iVar4 = xmlStrEqual(p_Var1->name,"base"), ownerComp = extraout_RDX_00, iVar4 == 0))
      goto LAB_001c0be9;
    }
    else {
      iVar4 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      ownerComp = extraout_RDX;
      if (iVar4 != 0) {
LAB_001c0be9:
        xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var1,ownerComp,pxVar5);
      }
    }
  }
  pxVar5 = xmlSchemaGetPropNode(node,"id");
  if (pxVar5 != (xmlAttrPtr)0x0) {
    xmlSchemaPValAttrNodeID(ctxt,pxVar5);
  }
  schema_00 = local_38;
  name = &local_48->baseNs;
  uri = &local_48->base;
  ownerElem = (xmlNodePtr)0x207de6;
  message = uri;
  iVar4 = xmlSchemaPValAttrQName
                    (ctxt,local_38,(xmlSchemaBasicItemPtr)node,(xmlNodePtr)0x207de6,(char *)name,uri
                     ,in_stack_ffffffffffffffa8);
  pxVar6 = (xmlSchemaTypePtr)CONCAT44(extraout_var,iVar4);
  if ((iVar4 == 0) && (*uri == (xmlChar *)0x0)) {
    xmlSchemaPMissingAttrErr
              (ctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x207de6,ownerElem,(char *)name,
               (char *)message);
    pxVar6 = extraout_RAX;
  }
  xVar3 = local_3c;
  pxVar2 = (xmlSchemaTypePtr)node->children;
  local_50 = pxVar2;
  if ((pxVar2 != (xmlSchemaTypePtr)0x0) && (pxVar2->node != (xmlNodePtr)0x0)) {
    iVar4 = xmlStrEqual(pxVar2->name,"annotation");
    pxVar6 = (xmlSchemaTypePtr)CONCAT44(extraout_var_00,iVar4);
    if (iVar4 != 0) {
      iVar4 = xmlStrEqual(pxVar2->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      pxVar6 = (xmlSchemaTypePtr)CONCAT44(extraout_var_01,iVar4);
      if (iVar4 != 0) {
        annot = xmlSchemaParseAnnotation(ctxt,(xmlNodePtr)pxVar2,1);
        xmlSchemaAddAnnotation((xmlSchemaAnnotItemPtr)local_48,annot);
        pxVar6 = (xmlSchemaTypePtr)pxVar2->annot;
        local_50 = pxVar6;
      }
    }
  }
  pxVar2 = local_50;
  if ((xVar3 != XML_SCHEMA_TYPE_COMPLEX_CONTENT) || (local_50 == (xmlSchemaTypePtr)0x0))
  goto LAB_001c0e07;
  if (local_50->node == (xmlNodePtr)0x0) {
LAB_001c0d4c:
    if (pxVar2 == (xmlSchemaTypePtr)0x0) goto LAB_001c0e07;
    if (pxVar2->node != (xmlNodePtr)0x0) {
      iVar4 = xmlStrEqual(pxVar2->name,(xmlChar *)"choice");
      pxVar6 = (xmlSchemaTypePtr)CONCAT44(extraout_var_04,iVar4);
      if (iVar4 != 0) {
        iVar4 = xmlStrEqual(pxVar2->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        pxVar6 = (xmlSchemaTypePtr)CONCAT44(extraout_var_05,iVar4);
        if (iVar4 != 0) {
          type = XML_SCHEMA_TYPE_CHOICE;
          goto LAB_001c0dea;
        }
      }
    }
    if (pxVar2 == (xmlSchemaTypePtr)0x0) goto LAB_001c0e07;
    if (pxVar2->node != (xmlNodePtr)0x0) {
      iVar4 = xmlStrEqual(pxVar2->name,"sequence");
      pxVar6 = (xmlSchemaTypePtr)CONCAT44(extraout_var_06,iVar4);
      if (iVar4 != 0) {
        iVar4 = xmlStrEqual(pxVar2->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        pxVar6 = (xmlSchemaTypePtr)CONCAT44(extraout_var_07,iVar4);
        if (iVar4 != 0) {
          type = XML_SCHEMA_TYPE_SEQUENCE;
          goto LAB_001c0dea;
        }
      }
    }
    if ((pxVar2 == (xmlSchemaTypePtr)0x0) || (pxVar2->node == (xmlNodePtr)0x0)) goto LAB_001c0e07;
    iVar4 = xmlStrEqual(pxVar2->name,"group");
    pxVar6 = (xmlSchemaTypePtr)CONCAT44(extraout_var_11,iVar4);
    if (iVar4 == 0) goto LAB_001c0e07;
    iVar4 = xmlStrEqual(pxVar2->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
    pxVar6 = (xmlSchemaTypePtr)CONCAT44(extraout_var_12,iVar4);
    if (iVar4 == 0) goto LAB_001c0e07;
    pxVar6 = (xmlSchemaTypePtr)xmlSchemaParseModelGroupDefRef(ctxt,schema_00,(xmlNodePtr)pxVar2);
  }
  else {
    iVar4 = xmlStrEqual(local_50->name,"all");
    pxVar6 = (xmlSchemaTypePtr)CONCAT44(extraout_var_02,iVar4);
    if (iVar4 == 0) goto LAB_001c0d4c;
    iVar4 = xmlStrEqual(pxVar2->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
    pxVar6 = (xmlSchemaTypePtr)CONCAT44(extraout_var_03,iVar4);
    if (iVar4 == 0) goto LAB_001c0d4c;
    type = XML_SCHEMA_TYPE_ALL;
LAB_001c0dea:
    pxVar6 = (xmlSchemaTypePtr)xmlSchemaParseModelGroup(ctxt,schema_00,(xmlNodePtr)pxVar2,type,1);
  }
  local_48->subtypes = pxVar6;
  pxVar6 = (xmlSchemaTypePtr)pxVar2->annot;
  local_50 = pxVar6;
LAB_001c0e07:
  if (local_50 != (xmlSchemaTypePtr)0x0) {
    iVar4 = xmlSchemaParseLocalAttributes
                      (ctxt,schema_00,(xmlNodePtr *)&local_50,
                       (xmlSchemaItemListPtr *)&local_48->attrUses,0xd,(int *)0x0);
    pxVar2 = local_50;
    pxVar6 = (xmlSchemaTypePtr)CONCAT44(extraout_var_08,iVar4);
    if (iVar4 == -1) {
      return pxVar6;
    }
    if ((local_50 != (xmlSchemaTypePtr)0x0) && (local_50->node != (xmlNodePtr)0x0)) {
      iVar4 = xmlStrEqual(local_50->name,(xmlChar *)"anyAttribute");
      pxVar6 = (xmlSchemaTypePtr)CONCAT44(extraout_var_09,iVar4);
      if (iVar4 != 0) {
        iVar4 = xmlStrEqual(pxVar2->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        pxVar6 = (xmlSchemaTypePtr)CONCAT44(extraout_var_10,iVar4);
        if (iVar4 != 0) {
          pxVar7 = xmlSchemaParseAnyAttribute(ctxt,schema_00,(xmlNodePtr)pxVar2);
          ctxt->ctxtType->attributeWildcard = pxVar7;
          pxVar6 = (xmlSchemaTypePtr)pxVar2->annot;
          local_50 = pxVar6;
        }
      }
    }
  }
  if (local_50 == (xmlSchemaTypePtr)0x0) {
    return pxVar6;
  }
  message_00 = "(annotation?, ((attribute | attributeGroup)*, anyAttribute?))";
  if (xVar3 == XML_SCHEMA_TYPE_COMPLEX_CONTENT) {
    message_00 = 
    "(annotation?, ((group | all | choice | sequence)?, ((attribute | attributeGroup)*, anyAttribute?)))"
    ;
  }
  xmlSchemaPContentErr
            (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,(xmlNodePtr)local_50,
             (xmlNodePtr)0x0,message_00,(char *)child);
  return extraout_RAX_00;
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaParseExtension(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                        xmlNodePtr node, xmlSchemaTypeType parentType)
{
    xmlSchemaTypePtr type;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);
    /* Not a component, don't create it. */
    type = ctxt->ctxtType;
    type->flags |= XML_SCHEMAS_TYPE_DERIVATION_METHOD_EXTENSION;

    /*
    * Check for illegal attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if ((!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "base"))) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }

    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");

    /*
    * Attribute "base" - mandatory.
    */
    if ((xmlSchemaPValAttrQName(ctxt, schema, NULL, node,
	"base", &(type->baseNs), &(type->base)) == 0) &&
	(type->base == NULL)) {
	xmlSchemaPMissingAttrErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_MISSING,
	    NULL, node, "base", NULL);
    }
    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
	/*
	* Add the annotation to the type ancestor.
	*/
	xmlSchemaAddAnnotation((xmlSchemaAnnotItemPtr) type,
	    xmlSchemaParseAnnotation(ctxt, child, 1));
        child = child->next;
    }
    if (parentType == XML_SCHEMA_TYPE_COMPLEX_CONTENT) {
	/*
	* Corresponds to <complexType><complexContent><extension>... and:
	*
	* Model groups <all>, <choice>, <sequence> and <group>.
	*/
	if (IS_SCHEMA(child, "all")) {
	    type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroup(ctxt, schema,
		    child, XML_SCHEMA_TYPE_ALL, 1);
	    child = child->next;
	} else if (IS_SCHEMA(child, "choice")) {
	    type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroup(ctxt, schema,
		    child, XML_SCHEMA_TYPE_CHOICE, 1);
	    child = child->next;
	} else if (IS_SCHEMA(child, "sequence")) {
	    type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroup(ctxt, schema,
		child, XML_SCHEMA_TYPE_SEQUENCE, 1);
	    child = child->next;
	} else if (IS_SCHEMA(child, "group")) {
	    type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroupDefRef(ctxt, schema, child);
	    /*
	    * Note that the reference will be resolved in
	    * xmlSchemaResolveTypeReferences();
	    */
	    child = child->next;
	}
    }
    if (child != NULL) {
	/*
	* Attribute uses/declarations.
	*/
	if (xmlSchemaParseLocalAttributes(ctxt, schema, &child,
	    (xmlSchemaItemListPtr *) &(type->attrUses),
	    XML_SCHEMA_TYPE_EXTENSION, NULL) == -1)
	    return(NULL);
	/*
	* Attribute wildcard.
	*/
	if (IS_SCHEMA(child, "anyAttribute")) {
	    ctxt->ctxtType->attributeWildcard =
		xmlSchemaParseAnyAttribute(ctxt, schema, child);
	    child = child->next;
	}
    }
    if (child != NULL) {
	if (parentType == XML_SCHEMA_TYPE_COMPLEX_CONTENT) {
	    /* Complex content extension. */
	    xmlSchemaPContentErr(ctxt,
		XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child, NULL,
		"(annotation?, ((group | all | choice | sequence)?, "
		"((attribute | attributeGroup)*, anyAttribute?)))");
	} else {
	    /* Simple content extension. */
	    xmlSchemaPContentErr(ctxt,
		XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child, NULL,
		"(annotation?, ((attribute | attributeGroup)*, "
		"anyAttribute?))");
	}
    }
    return (NULL);
}